

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_74(QPDF *pdf,char *arg2)

{
  bool bVar1;
  ostream *poVar2;
  longlong *plVar3;
  void *this;
  string *psVar4;
  QPDFWriter local_408 [8];
  QPDFWriter w;
  string local_3f8 [32];
  string *local_3d8;
  T *i_2;
  iterator __end1_2;
  iterator __begin1_2;
  QPDFNameTreeObjectHelper *__range1_2;
  string local_330;
  allocator<char> local_309;
  string local_308;
  allocator<char> local_2e1;
  string local_2e0 [32];
  QPDFObjectHandle local_2c0;
  QPDFObjectHandle local_2b0;
  QPDFNameTreeObjectHelper local_2a0 [8];
  QPDFNameTreeObjectHelper split3;
  T *i_1;
  iterator __end1_1;
  iterator __begin1_1;
  QPDFNameTreeObjectHelper *__range1_1;
  string local_1c0;
  anon_class_1_0_00000001 local_19a;
  allocator<char> local_199;
  string local_198 [6];
  anon_class_1_0_00000001 check_split2;
  QPDFObjectHandle local_178;
  QPDFObjectHandle local_168;
  QPDFNameTreeObjectHelper local_158 [8];
  QPDFNameTreeObjectHelper split2;
  T *i;
  iterator __end1;
  iterator __begin1;
  QPDFNumberTreeObjectHelper *__range1;
  anon_class_8_1_6bbe3995 check_split1;
  allocator<char> local_91;
  string local_90 [32];
  QPDFObjectHandle local_70;
  QPDFObjectHandle local_60;
  QPDFNumberTreeObjectHelper local_50 [8];
  QPDFNumberTreeObjectHelper split1;
  char *arg2_local;
  QPDF *pdf_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"/Split1");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  QPDF::getTrailer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_90,"/Split1",&local_91);
  QPDFObjectHandle::getKey((string *)&local_60);
  QPDFNumberTreeObjectHelper::QPDFNumberTreeObjectHelper
            (local_50,(QPDFObjectHandle *)&local_60,pdf,true);
  QPDFObjectHandle::~QPDFObjectHandle(&local_60);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  QPDFObjectHandle::~QPDFObjectHandle(&local_70);
  QPDFNumberTreeObjectHelper::setSplitThreshold((int)local_50);
  __range1 = local_50;
  test_74::anon_class_8_1_6bbe3995::operator()((anon_class_8_1_6bbe3995 *)&__range1,0xf);
  test_74::anon_class_8_1_6bbe3995::operator()((anon_class_8_1_6bbe3995 *)&__range1,0x23);
  test_74::anon_class_8_1_6bbe3995::operator()((anon_class_8_1_6bbe3995 *)&__range1,0x7d);
  QPDFNumberTreeObjectHelper::begin();
  QPDFNumberTreeObjectHelper::end();
  while( true ) {
    bVar1 = QPDFNumberTreeObjectHelper::iterator::operator!=
                      ((iterator *)
                       &__end1.ivalue.second.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                       (iterator *)&i);
    if (!bVar1) break;
    plVar3 = (longlong *)
             QPDFNumberTreeObjectHelper::iterator::operator*
                       ((iterator *)
                        &__end1.ivalue.second.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    this = (void *)std::ostream::operator<<(&std::cout,*plVar3);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    QPDFNumberTreeObjectHelper::iterator::operator++
              ((iterator *)
               &__end1.ivalue.second.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  QPDFNumberTreeObjectHelper::iterator::~iterator((iterator *)&i);
  QPDFNumberTreeObjectHelper::iterator::~iterator
            ((iterator *)
             &__end1.ivalue.second.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  poVar2 = std::operator<<((ostream *)&std::cout,"/Split2");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  QPDF::getTrailer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_198,"/Split2",&local_199);
  QPDFObjectHandle::getKey((string *)&local_168);
  QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper
            (local_158,(QPDFObjectHandle *)&local_168,pdf,true);
  QPDFObjectHandle::~QPDFObjectHandle(&local_168);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator(&local_199);
  QPDFObjectHandle::~QPDFObjectHandle(&local_178);
  QPDFNameTreeObjectHelper::setSplitThreshold((int)local_158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"C",(allocator<char> *)((long)&__range1_1 + 7));
  test_74::anon_class_1_0_00000001::operator()(&local_19a,local_158,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_1 + 7));
  QPDFNameTreeObjectHelper::begin();
  QPDFNameTreeObjectHelper::end();
  while( true ) {
    bVar1 = QPDFNameTreeObjectHelper::iterator::operator!=
                      ((iterator *)
                       &__end1_1.ivalue.second.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                       (iterator *)&i_1);
    if (!bVar1) break;
    psVar4 = (string *)QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_();
    poVar2 = std::operator<<((ostream *)&std::cout,psVar4);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    QPDFNameTreeObjectHelper::iterator::operator++
              ((iterator *)
               &__end1_1.ivalue.second.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&i_1);
  QPDFNameTreeObjectHelper::iterator::~iterator
            ((iterator *)
             &__end1_1.ivalue.second.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  poVar2 = std::operator<<((ostream *)&std::cout,"/Split3");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  QPDF::getTrailer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2e0,"/Split3",&local_2e1);
  QPDFObjectHandle::getKey((string *)&local_2b0);
  QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper
            (local_2a0,(QPDFObjectHandle *)&local_2b0,pdf,true);
  QPDFObjectHandle::~QPDFObjectHandle(&local_2b0);
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  QPDFObjectHandle::~QPDFObjectHandle(&local_2c0);
  QPDFNameTreeObjectHelper::setSplitThreshold((int)local_2a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"P",&local_309);
  test_74::anon_class_1_0_00000001::operator()(&local_19a,local_2a0,&local_308);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator(&local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,anon_var_dwarf_1b4af,(allocator<char> *)((long)&__range1_2 + 7));
  test_74::anon_class_1_0_00000001::operator()(&local_19a,local_2a0,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_2 + 7));
  QPDFNameTreeObjectHelper::begin();
  QPDFNameTreeObjectHelper::end();
  while( true ) {
    bVar1 = QPDFNameTreeObjectHelper::iterator::operator!=
                      ((iterator *)
                       &__end1_2.ivalue.second.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                       (iterator *)&i_2);
    if (!bVar1) break;
    local_3d8 = (string *)QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_();
    poVar2 = std::operator<<((ostream *)&std::cout,local_3d8);
    poVar2 = std::operator<<(poVar2," ");
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar2 = std::operator<<(poVar2,local_3f8);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_3f8);
    QPDFNameTreeObjectHelper::iterator::operator++
              ((iterator *)
               &__end1_2.ivalue.second.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&i_2);
  QPDFNameTreeObjectHelper::iterator::~iterator
            ((iterator *)
             &__end1_2.ivalue.second.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFWriter::QPDFWriter(local_408,pdf,"a.pdf");
  QPDFWriter::setStaticID(SUB81(local_408,0));
  QPDFWriter::setQDFMode(SUB81(local_408,0));
  QPDFWriter::write();
  QPDFWriter::~QPDFWriter(local_408);
  QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(local_2a0);
  QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(local_158);
  QPDFNumberTreeObjectHelper::~QPDFNumberTreeObjectHelper(local_50);
  return;
}

Assistant:

static void
test_74(QPDF& pdf, char const* arg2)
{
    // This test is crafted to work with split-nntree.pdf
    std::cout << "/Split1" << std::endl;
    auto split1 = QPDFNumberTreeObjectHelper(pdf.getTrailer().getKey("/Split1"), pdf);
    split1.setSplitThreshold(4);
    auto check_split1 = [&split1](int k) {
        auto i = split1.insert(k, QPDFObjectHandle::newString(QUtil::int_to_string(k)));
        assert(i->first == k);
    };
    check_split1(15);
    check_split1(35);
    check_split1(125);
    for (auto const& i: split1) {
        std::cout << i.first << std::endl;
    }

    std::cout << "/Split2" << std::endl;
    auto split2 = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey("/Split2"), pdf);
    split2.setSplitThreshold(4);
    auto check_split2 = [](QPDFNameTreeObjectHelper& noh, std::string const& k) {
        auto i = noh.insert(k, QPDFObjectHandle::newUnicodeString(k));
        assert(i->first == k);
    };
    check_split2(split2, "C");
    for (auto const& i: split2) {
        std::cout << i.first << std::endl;
    }

    std::cout << "/Split3" << std::endl;
    auto split3 = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey("/Split3"), pdf);
    split3.setSplitThreshold(4);
    check_split2(split3, "P");
    check_split2(split3, "\xcf\x80");
    for (auto& i: split3) {
        std::cout << i.first << " " << i.second.unparse() << std::endl;
    }

    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setQDFMode(true);
    w.write();
}